

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubD::ReturnVertexForExperts(ON_SubD *this,ON_SubDVertex *v)

{
  bool bVar1;
  ON_SubDimple *this_00;
  ON_SubDimple *subdimple;
  ON_SubDVertex *v_local;
  ON_SubD *this_local;
  
  if (v == (ON_SubDVertex *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = InSubD(this,v);
    if ((((bVar1) && (bVar1 = ON_SubDComponentBase::IsActive(&v->super_ON_SubDComponentBase), bVar1)
         ) && (v->m_edge_count == 0)) &&
       ((v->m_face_count == 0 && (this_00 = SubDimple(this,false), this_00 != (ON_SubDimple *)0x0)))
       ) {
      ON_SubDimple::ReturnVertex(this_00,v);
      this_local._7_1_ = true;
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::ReturnVertexForExperts(
  ON_SubDVertex* v
)
{
  if (nullptr == v)
    return false;

  if (this->InSubD(v) && v->IsActive() && 0 == v->m_edge_count && 0 == v->m_face_count )
  {
    ON_SubDimple* subdimple = SubDimple(false);
    if (nullptr != subdimple)
    {
      subdimple->ReturnVertex(v);
      return true;
    }
  }

  // Caller is not an expert but a crash has been prevented.
  return ON_SUBD_RETURN_ERROR(false);
}